

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumericTests.cpp
# Opt level: O2

void testDiv(SVInt *a,SVInt *b,SVInt *c)

{
  logic_t lVar1;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  AssertionHandler catchAssertionHandler;
  SVInt p;
  ExprLhs<const_slang::SVInt_&> local_80;
  SVInt r;
  SVInt q;
  enable_if_t<Detail::conjunction<Detail::is_ge_comparable<const_SVInt_&,_const_SVInt_&>,_Detail::negation<capture_by_value<Detail::RemoveCVRef_t<const_SVInt_&>_>_>_>::value,_BinaryExpr<const_SVInt_&,_const_SVInt_&>_>
  local_58;
  
  local_58.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x8acc98;
  local_58.super_ITransientExpression.m_isBinaryExpression = true;
  local_58.super_ITransientExpression.m_result = true;
  local_58.super_ITransientExpression._10_6_ = 0;
  capturedExpression.m_size = 6;
  capturedExpression.m_start = "a >= b";
  macroName.m_size = 7;
  macroName.m_start = "REQUIRE";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)&local_58,capturedExpression,Normal)
  ;
  p.super_SVIntStorage.field_0 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)a;
  Catch::operator>=(&local_58,(ExprLhs<const_slang::SVInt_&> *)&p,b);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_58.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x8acc98;
  local_58.super_ITransientExpression.m_isBinaryExpression = true;
  local_58.super_ITransientExpression.m_result = true;
  local_58.super_ITransientExpression._10_6_ = 0;
  capturedExpression_00.m_size = 5;
  capturedExpression_00.m_start = "a > c";
  macroName_00.m_size = 7;
  macroName_00.m_start = "REQUIRE";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_00,(SourceLineInfo *)&local_58,capturedExpression_00,
             Normal);
  p.super_SVIntStorage.field_0 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)a;
  Catch::operator>(&local_58,(ExprLhs<const_slang::SVInt_&> *)&p,c);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  slang::SVInt::operator*((SVInt *)&catchAssertionHandler,a);
  slang::SVInt::operator+(&p,(SVInt *)&catchAssertionHandler);
  slang::SVInt::~SVInt((SVInt *)&catchAssertionHandler);
  slang::SVInt::operator/(&q,&p);
  slang::SVInt::operator%(&r,&p);
  local_58.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x8acc98;
  local_58.super_ITransientExpression.m_isBinaryExpression = true;
  local_58.super_ITransientExpression.m_result = true;
  local_58.super_ITransientExpression._10_6_ = 0;
  capturedExpression_01.m_size = 6;
  capturedExpression_01.m_start = "b == q";
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_01,(SourceLineInfo *)&local_58,capturedExpression_01,
             ContinueOnFailure);
  local_80.m_lhs = b;
  Catch::operator==((enable_if_t<Detail::conjunction<Detail::is_eq_comparable<const_SVInt_&,_SVInt_&>,_Detail::negation<capture_by_value<Detail::RemoveCVRef_t<SVInt_&>_>_>_>::value,_BinaryExpr<const_SVInt_&,_SVInt_&>_>
                     *)&local_58,&local_80,&q);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_58.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x8acc98;
  local_58.super_ITransientExpression.m_isBinaryExpression = true;
  local_58.super_ITransientExpression.m_result = true;
  local_58.super_ITransientExpression._10_6_ = 0;
  capturedExpression_02.m_size = 6;
  capturedExpression_02.m_start = "c == r";
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_02,(SourceLineInfo *)&local_58,capturedExpression_02,
             ContinueOnFailure);
  local_80.m_lhs = c;
  Catch::operator==((enable_if_t<Detail::conjunction<Detail::is_eq_comparable<const_SVInt_&,_SVInt_&>,_Detail::negation<capture_by_value<Detail::RemoveCVRef_t<SVInt_&>_>_>_>::value,_BinaryExpr<const_SVInt_&,_SVInt_&>_>
                     *)&local_58,&local_80,&r);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  lVar1 = slang::SVInt::operator>(b,c);
  if (((lVar1.value != '\0') && (lVar1.value != 0x80)) && (lVar1.value != '@')) {
    slang::SVInt::operator/((SVInt *)&catchAssertionHandler,&p);
    slang::SVInt::operator=(&q,(SVInt *)&catchAssertionHandler);
    slang::SVInt::~SVInt((SVInt *)&catchAssertionHandler);
    slang::SVInt::operator%((SVInt *)&catchAssertionHandler,&p);
    slang::SVInt::operator=(&r,(SVInt *)&catchAssertionHandler);
    slang::SVInt::~SVInt((SVInt *)&catchAssertionHandler);
    local_58.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x8acc98;
    local_58.super_ITransientExpression.m_isBinaryExpression = true;
    local_58.super_ITransientExpression.m_result = true;
    local_58.super_ITransientExpression._10_6_ = 0;
    capturedExpression_03.m_size = 6;
    capturedExpression_03.m_start = "a == q";
    macroName_03.m_size = 5;
    macroName_03.m_start = "CHECK";
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,macroName_03,(SourceLineInfo *)&local_58,capturedExpression_03
               ,ContinueOnFailure);
    local_80.m_lhs = a;
    Catch::operator==((enable_if_t<Detail::conjunction<Detail::is_eq_comparable<const_SVInt_&,_SVInt_&>,_Detail::negation<capture_by_value<Detail::RemoveCVRef_t<SVInt_&>_>_>_>::value,_BinaryExpr<const_SVInt_&,_SVInt_&>_>
                       *)&local_58,&local_80,&q);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58.super_ITransientExpression)
    ;
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    local_58.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x8acc98;
    local_58.super_ITransientExpression.m_isBinaryExpression = true;
    local_58.super_ITransientExpression.m_result = true;
    local_58.super_ITransientExpression._10_6_ = 0;
    capturedExpression_04.m_size = 6;
    capturedExpression_04.m_start = "c == r";
    macroName_04.m_size = 5;
    macroName_04.m_start = "CHECK";
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,macroName_04,(SourceLineInfo *)&local_58,capturedExpression_04
               ,ContinueOnFailure);
    local_80.m_lhs = c;
    Catch::operator==((enable_if_t<Detail::conjunction<Detail::is_eq_comparable<const_SVInt_&,_SVInt_&>,_Detail::negation<capture_by_value<Detail::RemoveCVRef_t<SVInt_&>_>_>_>::value,_BinaryExpr<const_SVInt_&,_SVInt_&>_>
                       *)&local_58,&local_80,&r);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58.super_ITransientExpression)
    ;
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  }
  slang::SVInt::~SVInt(&r);
  slang::SVInt::~SVInt(&q);
  slang::SVInt::~SVInt(&p);
  return;
}

Assistant:

void testDiv(const SVInt& a, const SVInt& b, const SVInt& c) {
    // Test division and remainder using: (a * b + c) / a
    REQUIRE(a >= b);
    REQUIRE(a > c);

    auto p = a * b + c;
    auto q = p / a;
    auto r = p % a;
    CHECK(b == q);
    CHECK(c == r);

    if (b > c) {
        q = p / b;
        r = p % b;
        CHECK(a == q);
        CHECK(c == r);
    }
}